

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_gzip_filter_module.c
# Opt level: O0

ngx_int_t ngx_http_gzip_ratio_variable
                    (ngx_http_request_t *r,ngx_http_variable_value_t *v,uintptr_t data)

{
  void *pvVar1;
  u_char *puVar2;
  ngx_http_gzip_ctx_t *ctx;
  ngx_uint_t zfrac;
  ngx_uint_t zint;
  uintptr_t data_local;
  ngx_http_variable_value_t *v_local;
  ngx_http_request_t *r_local;
  
  *(uint *)v = *(uint *)v & 0xefffffff | 0x10000000;
  *(uint *)v = *(uint *)v & 0xdfffffff;
  *(uint *)v = *(uint *)v & 0xbfffffff;
  pvVar1 = r->ctx[ngx_http_gzip_filter_module.ctx_index];
  if ((pvVar1 == (void *)0x0) || (*(long *)((long)pvVar1 + 0x80) == 0)) {
    *(uint *)v = *(uint *)v & 0xbfffffff | 0x40000000;
    r_local = (ngx_http_request_t *)0x0;
  }
  else {
    puVar2 = (u_char *)ngx_pnalloc(r->pool,0xe);
    v->data = puVar2;
    if (v->data == (u_char *)0x0) {
      r_local = (ngx_http_request_t *)0xffffffffffffffff;
    }
    else {
      zfrac = *(ulong *)((long)pvVar1 + 0x78) / *(ulong *)((long)pvVar1 + 0x80);
      ctx = (ngx_http_gzip_ctx_t *)
            (((ulong)(*(long *)((long)pvVar1 + 0x78) * 100) / *(ulong *)((long)pvVar1 + 0x80)) % 100
            );
      if ((4 < ((ulong)(*(long *)((long)pvVar1 + 0x78) * 1000) / *(ulong *)((long)pvVar1 + 0x80)) %
               10) &&
         (ctx = (ngx_http_gzip_ctx_t *)((long)&ctx->in + 1), (ngx_http_gzip_ctx_t *)0x63 < ctx)) {
        zfrac = zfrac + 1;
        ctx = (ngx_http_gzip_ctx_t *)0x0;
      }
      puVar2 = ngx_sprintf(v->data,"%ui.%02ui",zfrac,ctx);
      *(uint *)v = *(uint *)v & 0xf0000000 | (int)puVar2 - (int)v->data & 0xfffffffU;
      r_local = (ngx_http_request_t *)0x0;
    }
  }
  return (ngx_int_t)r_local;
}

Assistant:

static ngx_int_t
ngx_http_gzip_ratio_variable(ngx_http_request_t *r,
    ngx_http_variable_value_t *v, uintptr_t data)
{
    ngx_uint_t            zint, zfrac;
    ngx_http_gzip_ctx_t  *ctx;

    v->valid = 1;
    v->no_cacheable = 0;
    v->not_found = 0;

    ctx = ngx_http_get_module_ctx(r, ngx_http_gzip_filter_module);

    if (ctx == NULL || ctx->zout == 0) {
        v->not_found = 1;
        return NGX_OK;
    }

    v->data = ngx_pnalloc(r->pool, NGX_INT32_LEN + 3);
    if (v->data == NULL) {
        return NGX_ERROR;
    }

    zint = (ngx_uint_t) (ctx->zin / ctx->zout);
    zfrac = (ngx_uint_t) ((ctx->zin * 100 / ctx->zout) % 100);

    if ((ctx->zin * 1000 / ctx->zout) % 10 > 4) {

        /* the rounding, e.g., 2.125 to 2.13 */

        zfrac++;

        if (zfrac > 99) {
            zint++;
            zfrac = 0;
        }
    }

    v->len = ngx_sprintf(v->data, "%ui.%02ui", zint, zfrac) - v->data;

    return NGX_OK;
}